

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O1

shared_ptr<kratos::Var> __thiscall
kratos::VarVarSlice::slice_var(VarVarSlice *this,shared_ptr<kratos::Var> *var)

{
  long *plVar1;
  long lVar2;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<kratos::Var> sVar4;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  plVar1 = (long *)*in_RDX;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            (local_30,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                      &var[0x29].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[6]._M_use_count);
  lVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,local_30);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x68));
  _Var3._M_pi = extraout_RDX;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar4.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> slice_var(std::shared_ptr<Var> var) override {
        return var->operator[](sliced_var_->shared_from_this()).shared_from_this();
    }